

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPoints.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderPointsVerification::initTest(TessellationShaderPointsVerification *this)

{
  _tessellation_primitive_mode primitive_mode;
  _tessellation_shader_vertex_spacing _Var1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  NotSupportedError *this_01;
  long lVar4;
  _tessellation_levels *levels;
  pointer p_Var5;
  ulong uVar6;
  GLint gl_max_tess_gen_level_value;
  _run run;
  _tessellation_levels_set levels_set;
  Functions *gl;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&run,"Tessellation shader functionality not supported, skipping",
               (allocator<char> *)&levels_set);
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)&run);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (*gl->genVertexArrays)(1,&this->m_vao_id);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPoints.cpp"
                  ,0x29c);
  (*gl->bindVertexArray)(this->m_vao_id);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPoints.cpp"
                  ,0x29f);
  gl_max_tess_gen_level_value = 0;
  (*gl->getIntegerv)((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
                     &gl_max_tess_gen_level_value);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPoints.cpp"
                  ,0x2a5);
  uVar6 = 0;
  do {
    if (uVar6 == 3) {
      this_00 = (TessellationShaderUtils *)operator_new(0x20);
      TessellationShaderUtils::TessellationShaderUtils(this_00,gl,&this->super_TestCaseBase);
      this->m_utils = this_00;
      return;
    }
    levels_set.
    super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    levels_set.
    super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    levels_set.
    super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    primitive_mode = (&DAT_017b4758)[uVar6];
    TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
              ((_tessellation_levels_set *)&run,primitive_mode,gl_max_tess_gen_level_value,
               TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES);
    std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
    _M_move_assign(&levels_set,&run);
    std::_Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
    ~_Vector_base((_Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                   *)&run);
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      _Var1 = (&DAT_017b4758)[lVar4];
      for (p_Var5 = levels_set.
                    super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          p_Var5 != levels_set.
                    super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                    ._M_impl.super__Vector_impl_data._M_finish; p_Var5 = p_Var5 + 1) {
        if ((uVar6 & 1) == 0 && (int)lVar4 == 0) {
          if (1.0 < p_Var5->inner[0]) {
            if (1.0 < p_Var5->inner[1]) goto LAB_00d11076;
          }
        }
        else {
LAB_00d11076:
          run.inner = *&p_Var5->inner;
          run.outer._0_8_ = *(undefined8 *)p_Var5->outer;
          run.outer._8_8_ = *(undefined8 *)(p_Var5->outer + 2);
          run.vertex_spacing = _Var1;
          run.primitive_mode = primitive_mode;
          std::
          vector<glcts::TessellationShaderPointsVerification::_run,_std::allocator<glcts::TessellationShaderPointsVerification::_run>_>
          ::push_back(&this->m_runs,&run);
        }
      }
    }
    std::_Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
    ~_Vector_base(&levels_set.
                   super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                 );
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void TessellationShaderPointsVerification::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize and bind vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize all test iterations */
	const _tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);

	const _tessellation_shader_vertex_spacing vertex_spacings[] = {
		TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
		TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
	};
	const unsigned int n_vertex_spacings = sizeof(vertex_spacings) / sizeof(vertex_spacings[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_levels_set	 levels_set;
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		levels_set = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
			primitive_mode, gl_max_tess_gen_level_value,
			TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES);

		for (unsigned int n_vertex_spacing = 0; n_vertex_spacing < n_vertex_spacings; ++n_vertex_spacing)
		{
			_tessellation_shader_vertex_spacing vertex_spacing = vertex_spacings[n_vertex_spacing];

			for (_tessellation_levels_set_const_iterator levels_set_iterator = levels_set.begin();
				 levels_set_iterator != levels_set.end(); levels_set_iterator++)
			{
				const _tessellation_levels& levels = *levels_set_iterator;

				/* Skip border cases that this test cannot handle */
				if ((primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS ||
					 primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) &&
					vertex_spacing == TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD &&
					(levels.inner[0] <= 1 || levels.inner[1] <= 1))
				{
					continue;
				}

				/* Initialize a test run descriptor for the iteration-specific properties */
				_run run;

				memcpy(run.inner, levels.inner, sizeof(run.inner));
				memcpy(run.outer, levels.outer, sizeof(run.outer));

				run.primitive_mode = primitive_mode;
				run.vertex_spacing = vertex_spacing;

				m_runs.push_back(run);
			} /* for (all level sets) */
		}	 /* for (all vertex spacing modes) */
	}		  /* for (all primitive modes) */

	/* Initialize utils instance.
	 */
	m_utils = new TessellationShaderUtils(gl, this);
}